

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall
r_exec::CSTController::abduce(CSTController *this,HLPBindingMap *bm,Fact *super_goal)

{
  Sim *sim;
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  MatchResult MVar6;
  Goal *this_00;
  _Fact *this_01;
  Code *pCVar7;
  Group *group;
  uint64_t now;
  undefined4 extraout_var;
  Code *this_02;
  bool bVar8;
  float fVar9;
  _Fact *evidence;
  
  this_00 = _Fact::get_goal(&super_goal->super__Fact);
  this_01 = Goal::get_target(this_00);
  bVar1 = _Fact::is_anti_fact(this_01);
  fVar9 = _Fact::get_cfd(this_01);
  sim = (Sim *)(this_00->sim).object;
  pCVar7 = HLPController::get_unpacked_object(&this->super_HLPController);
  (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,2);
  uVar2 = r_code::Atom::asIndex();
  (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,(ulong)uVar2);
  uVar3 = r_code::Atom::getAtomCount();
  group = HLPController::get_host(&this->super_HLPController);
  now = (*Now)();
  uVar3 = uVar3 & 0xff;
  while( true ) {
    uVar2 = uVar2 + 1;
    bVar8 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar8) break;
    (*(pCVar7->super__Object)._vptr__Object[4])(pCVar7,(ulong)uVar2);
    uVar4 = r_code::Atom::asIndex();
    iVar5 = (*(pCVar7->super__Object)._vptr__Object[9])(pCVar7,(ulong)uVar4);
    this_02 = HLPBindingMap::bind_pattern(bm,(Code *)CONCAT44(extraout_var,iVar5));
    if (bVar1) {
      _Fact::set_opposite((_Fact *)this_02);
    }
    MVar6 = HLPController::check_evidences(&this->super_HLPController,(_Fact *)this_02,&evidence);
    if ((MVar6 == MATCH_FAILURE) &&
       (MVar6 = HLPController::check_predicted_evidences
                          (&this->super_HLPController,(_Fact *)this_02,&evidence),
       MVar6 - MATCH_SUCCESS_NEGATIVE < 2)) {
      inject_goal(this,bm,super_goal,(_Fact *)this_02,sim,now,(double)fVar9,(Code *)group);
    }
  }
  return;
}

Assistant:

void CSTController::abduce(HLPBindingMap *bm, Fact *super_goal)   // super_goal is f0->g->f1->icst or f0->g->|f1->icst.
{
    Goal *g = super_goal->get_goal();
    _Fact *super_goal_target = g->get_target();
    bool opposite = (super_goal_target->is_anti_fact());
    double confidence = super_goal_target->get_cfd();
    Sim *sim = g->sim;
    Code *cst = get_unpacked_object();
    uint16_t obj_set_index = cst->code(CST_OBJS).asIndex();
    uint16_t obj_count = cst->code(obj_set_index).getAtomCount();
    Group *host = get_host();
    uint64_t now = Now();

    for (uint16_t i = 1; i <= obj_count; ++i) {
        _Fact *pattern = (_Fact *)cst->get_reference(cst->code(obj_set_index + i).asIndex());
        _Fact *bound_pattern = (_Fact *)bm->bind_pattern(pattern);
        _Fact *evidence;

        if (opposite) {
            bound_pattern->set_opposite();
        }

        switch (check_evidences(bound_pattern, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // positive evidence, no need to produce a sub-goal: skip.
            break;

        case MATCH_SUCCESS_NEGATIVE: // negative evidence, no need to produce a sub-goal, the super-goal will probably fail within the target time frame: skip.
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_pattern, evidence)) {
            case MATCH_SUCCESS_POSITIVE:
                break;

            case MATCH_SUCCESS_NEGATIVE:
            case MATCH_FAILURE: // inject a sub-goal for the missing predicted positive evidence.
                inject_goal(bm, super_goal, bound_pattern, sim, now, confidence, host); // all sub-goals share the same sim.
                break;
            }
        }
    }
}